

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int luaK_code(FuncState *fs,Instruction i)

{
  int iVar1;
  Proto *f;
  Instruction *pIVar2;
  
  f = fs->f;
  pIVar2 = (Instruction *)
           luaM_growaux_(fs->ls->L,f->code,fs->pc,&f->sizecode,4,0x7fffffff,"opcodes");
  f->code = pIVar2;
  iVar1 = fs->pc;
  fs->pc = iVar1 + 1;
  pIVar2[iVar1] = i;
  savelineinfo(fs,f,fs->ls->lastline);
  return fs->pc + -1;
}

Assistant:

int luaK_code (FuncState *fs, Instruction i) {
  Proto *f = fs->f;
  /* put new instruction in code array */
  luaM_growvector(fs->ls->L, f->code, fs->pc, f->sizecode, Instruction,
                  MAX_INT, "opcodes");
  f->code[fs->pc++] = i;
  savelineinfo(fs, f, fs->ls->lastline);
  return fs->pc - 1;  /* index of new instruction */
}